

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

idx_t duckdb::JoinHashTable::FillWithHTOffsets(JoinHTScanState *state,Vector *addresses)

{
  data_ptr_t pdVar1;
  bool bVar2;
  data_ptr_t *ppdVar3;
  idx_t iVar4;
  idx_t i;
  idx_t iVar5;
  idx_t iVar6;
  
  pdVar1 = addresses->data;
  ppdVar3 = TupleDataChunkIterator::GetRowLocations(&state->iterator);
  iVar6 = 0;
  do {
    iVar4 = TupleDataChunkIterator::GetCurrentChunkCount(&state->iterator);
    for (iVar5 = 0; iVar4 != iVar5; iVar5 = iVar5 + 1) {
      *(data_ptr_t *)(pdVar1 + iVar5 * 8 + iVar6 * 8) = ppdVar3[iVar5];
    }
    iVar6 = iVar6 + iVar4;
    bVar2 = TupleDataChunkIterator::Next(&state->iterator);
  } while (bVar2);
  return iVar6;
}

Assistant:

idx_t JoinHashTable::FillWithHTOffsets(JoinHTScanState &state, Vector &addresses) {
	// iterate over HT
	auto key_locations = FlatVector::GetData<data_ptr_t>(addresses);
	idx_t key_count = 0;

	auto &iterator = state.iterator;
	const auto row_locations = iterator.GetRowLocations();
	do {
		const auto count = iterator.GetCurrentChunkCount();
		for (idx_t i = 0; i < count; i++) {
			key_locations[key_count + i] = row_locations[i];
		}
		key_count += count;
	} while (iterator.Next());

	return key_count;
}